

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O2

void __thiscall imrt::Station::printIntensity(Station *this,bool vector_form)

{
  double dVar1;
  int iVar2;
  ostream *poVar3;
  undefined7 in_register_00000031;
  int j;
  long lVar4;
  int j_1;
  int i;
  long lVar5;
  
  if ((int)CONCAT71(in_register_00000031,vector_form) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Angle ");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->angle);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::operator<<((ostream *)&std::cout," aperture intensities: ");
    std::ostream::_M_insert<double>
              ((this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[1]);
    for (lVar5 = 1; lVar5 < this->max_apertures; lVar5 = lVar5 + 1) {
      std::operator<<((ostream *)&std::cout,", ");
      std::ostream::_M_insert<double>
                ((this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar5]);
    }
    poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar3 = std::operator<<(poVar3," intensity matrix:");
    std::endl<char,std::char_traits<char>>(poVar3);
    lVar5 = 0;
    while( true ) {
      iVar2 = Collimator::getXdim(this->collimator);
      if (iVar2 <= lVar5) break;
      lVar4 = 0;
      while( true ) {
        iVar2 = Collimator::getYdim(this->collimator);
        if (iVar2 <= lVar4) break;
        printf("%2.0f ",(this->I).p[lVar5][lVar4]);
        lVar4 = lVar4 + 1;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      lVar5 = lVar5 + 1;
    }
  }
  else {
    lVar5 = 0;
    while( true ) {
      iVar2 = Collimator::getXdim(this->collimator);
      if (iVar2 <= lVar5) break;
      lVar4 = 0;
      while( true ) {
        iVar2 = Collimator::getYdim(this->collimator);
        if (iVar2 <= lVar4) break;
        dVar1 = (this->I).p[lVar5][lVar4];
        if ((dVar1 != -1.0) || (NAN(dVar1))) {
          printf("\t%2.1f");
        }
        lVar4 = lVar4 + 1;
      }
      lVar5 = lVar5 + 1;
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"nb_intensities:");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void Station::printIntensity(bool vector_form) {
	  if(!vector_form){
		  cout << "Angle "<< angle << endl; 
	    cout << " aperture intensities: ";
	    cout << intensity[1];
	    for (int i=1;i<max_apertures;i++)
	      cout << ", " << intensity[i];
	    cout << endl <<" intensity matrix:"<< endl;
		  for (int i=0; i<collimator.getXdim();i++) {
			  for (int j=0; j<collimator.getYdim(); j++) {
				  printf("%2.0f ", I(i,j));
			  }
			  cout << endl;
		  }
	  }else{
		  for (int i=0; i<collimator.getXdim();i++) {
			  for (int j=0; j<collimator.getYdim(); j++) {
				  if(I(i,j)!=-1.0) printf("\t%2.1f", I(i,j));
			  }
		  }
	  }

    cout << "nb_intensities:" << int2nb.size() << endl;
  }